

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDHash * __thiscall
ON_SubDimple::SubDHash
          (ON_SubDHash *__return_storage_ptr__,ON_SubDimple *this,ON_SubDHashType hash_type,
          bool bForceUpdate)

{
  ON__UINT64 OVar1;
  uint uVar2;
  ON_SubDHashType OVar3;
  bool bVar4;
  ON_SubDHashType OVar5;
  uint uVar6;
  uint uVar7;
  ON_SubDLevel *pOVar8;
  ON__UINT64 OVar9;
  ON__UINT64 OVar10;
  ON_SubDHash local_98;
  ON__UINT64 local_38;
  ON__UINT64 gsn;
  ON__UINT64 rsn;
  uint face_count;
  uint edge_count;
  ON_SubDHash *h;
  uint vertex_count;
  bool bForceUpdate_local;
  ON_SubDHashType hash_type_local;
  ON_SubDimple *this_local;
  
  h._6_1_ = bForceUpdate;
  h._7_1_ = hash_type;
  _vertex_count = this;
  pOVar8 = ActiveLevel(this);
  h._0_4_ = pOVar8->m_vertex_count;
  if ((uint)h == 0) {
    memcpy(__return_storage_ptr__,&ON_SubDHash::Empty,0x60);
  }
  else {
    if (h._7_1_ == TopologyAndEdgeCreases) {
      _face_count = &this->m_subd_toplology_and_edge_creases_hash;
    }
    else if (h._7_1_ == Geometry) {
      _face_count = &this->m_subd_geometry_hash;
    }
    else if (h._7_1_ == Topology) {
      _face_count = &this->m_subd_toplology_hash;
    }
    else {
      _face_count = (ON_SubDHash *)0x0;
    }
    if (_face_count == (ON_SubDHash *)0x0) {
      memcpy(__return_storage_ptr__,&ON_SubDHash::Empty,0x60);
    }
    else {
      pOVar8 = ActiveLevel(this);
      rsn._4_4_ = pOVar8->m_edge_count;
      pOVar8 = ActiveLevel(this);
      rsn._0_4_ = pOVar8->m_face_count;
      gsn = this->RuntimeSerialNumber;
      local_38 = GeometryContentSerialNumber(this);
      if (((((((h._6_1_ & 1) == 0) &&
             (bVar4 = ON_SubDHash::IsNotEmpty(_face_count), OVar3 = h._7_1_, bVar4)) &&
            (OVar5 = ON_SubDHash::HashType(_face_count), OVar10 = gsn, OVar3 == OVar5)) &&
           ((gsn != 0 &&
            (OVar9 = ON_SubDHash::SubDRuntimeSerialNumber(_face_count), OVar1 = local_38,
            OVar10 == OVar9)))) &&
          ((local_38 != 0 &&
           ((OVar10 = ON_SubDHash::SubDGeometryContentSerialNumber(_face_count), uVar2 = (uint)h,
            OVar1 == OVar10 &&
            (uVar6 = ON_SubDHash::VertexCount(_face_count), uVar7 = rsn._4_4_, uVar2 == uVar6))))))
         && ((uVar6 = ON_SubDHash::EdgeCount(_face_count), uVar2 = (uint)rsn, uVar7 == uVar6 &&
             (uVar7 = ON_SubDHash::FaceCount(_face_count), uVar2 == uVar7)))) {
        memcpy(__return_storage_ptr__,_face_count,0x60);
      }
      else {
        ON_SubDHash::Create(&local_98,h._7_1_,this);
        memcpy(_face_count,&local_98,0x5c);
        memcpy(__return_storage_ptr__,_face_count,0x60);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDHash ON_SubDimple::SubDHash(
  ON_SubDHashType hash_type,
  bool bForceUpdate
) const
{
  const unsigned vertex_count = this->ActiveLevel().m_vertex_count;
  if (0 == vertex_count)
    return ON_SubDHash::Empty;

  // m_subd_topologyX_hash, m_subd_topology_and_edge_crease_hash, and m_subd_geometry_hash
  // are mutable and use lazy evaluation to stay updated.
  // subd.GeometryContentSerialNumber() is used to detect stale values.
  ON_SubDHash* h;
  switch (hash_type)
  {
  case ON_SubDHashType::Topology:
    h = &this->m_subd_toplology_hash;
    break;
  case ON_SubDHashType::TopologyAndEdgeCreases:
    h = &this->m_subd_toplology_and_edge_creases_hash;
    break;
  case ON_SubDHashType::Geometry:
    h = &this->m_subd_geometry_hash;
    break;
  default:
    h = nullptr;
    break;
  }
  if ( nullptr == h)
    return ON_SubDHash::Empty;


  const unsigned edge_count = this->ActiveLevel().m_edge_count;
  const unsigned face_count = this->ActiveLevel().m_face_count;
  const ON__UINT64 rsn = this->RuntimeSerialNumber;
  const ON__UINT64 gsn = this->GeometryContentSerialNumber();
  if (
    false == bForceUpdate
    && h->IsNotEmpty()
    && hash_type == h->HashType()
    && rsn > 0 && rsn == h->SubDRuntimeSerialNumber()
    && gsn > 0 && gsn == h->SubDGeometryContentSerialNumber()
    && vertex_count == h->VertexCount()
    && edge_count == h->EdgeCount()
    && face_count == h->FaceCount()
    )
  {
    // The cache hash values are up to date (or should be).
    // If h is out of date, something somewhere modified the SubD components and 
    // failed to change the GeometryContentSerialNumber(). 
    // All C++ SDK opennurbs code changes gsn after modifying SubD geometry (or it's a bug that should be fixed).
    // The unwashed masses can do just about anything and that's why the bForceUpdate parameter is supplied.
    return *h;
  }

  // update cached value
  *h = ON_SubDHash::Create(hash_type,this);

  // return updated value
  return *h;
}